

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::SetColorWriteMaskIndexed
          (GLContextState *this,Uint32 RTIndex,Uint32 WriteMask)

{
  byte bVar1;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  if (this->m_ColorWriteMasks[RTIndex] != WriteMask) {
    bVar1 = (byte)WriteMask;
    (*__glewColorMaski)(RTIndex,bVar1 & 1,bVar1 >> 1 & 1,bVar1 >> 2 & 1,bVar1 >> 3 & 1);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[28],char[17],unsigned_int>
                (false,"SetColorWriteMaskIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x37e,(char (*) [28])"Failed to set GL color mask",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetColorWriteMaskIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x37e);
      std::__cxx11::string::~string((string *)&local_50);
    }
    this->m_ColorWriteMasks[RTIndex] = WriteMask;
    (this->m_bIndexedWriteMasks).m_EnableState = ENABLED;
  }
  return;
}

Assistant:

void GLContextState::SetColorWriteMaskIndexed(Uint32 RTIndex, Uint32 WriteMask)
{
    // Even though the write mask only applies to writes to a framebuffer, the mask state is NOT
    // Framebuffer state. So it is NOT part of a Framebuffer Object or the Default Framebuffer.
    // Binding a new framebuffer will NOT affect the mask.
    if (m_ColorWriteMasks[RTIndex] == WriteMask)
        return;

    // Note that glColorMaski() does not set color mask for the framebuffer
    // attachment point RTIndex. Rather it sets the mask for what was set
    // by the glDrawBuffers() function for the i-th output
    glColorMaski(RTIndex,
                 (WriteMask & COLOR_MASK_RED) ? GL_TRUE : GL_FALSE,
                 (WriteMask & COLOR_MASK_GREEN) ? GL_TRUE : GL_FALSE,
                 (WriteMask & COLOR_MASK_BLUE) ? GL_TRUE : GL_FALSE,
                 (WriteMask & COLOR_MASK_ALPHA) ? GL_TRUE : GL_FALSE);
    DEV_CHECK_GL_ERROR("Failed to set GL color mask");

    m_ColorWriteMasks[RTIndex] = WriteMask;

    m_bIndexedWriteMasks = true;
}